

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

void agc_noise(agc_t *agc,mfcc_t **cep,int32 nfr)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  mfcc_t mVar6;
  float fVar7;
  
  mVar6 = **cep;
  uVar4 = (ulong)(uint)nfr;
  if (0 < nfr) {
    uVar3 = 0;
    do {
      fVar7 = (float)*cep[uVar3];
      if ((float)mVar6 <= (float)*cep[uVar3]) {
        fVar7 = (float)mVar6;
      }
      mVar6 = (mfcc_t)fVar7;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (nfr < 1) {
    iVar2 = 0;
    fVar7 = 0.0;
  }
  else {
    fVar5 = (float)mVar6 + (float)agc->noise_thresh;
    fVar7 = 0.0;
    uVar3 = 0;
    iVar2 = 0;
    do {
      fVar1 = (float)*cep[uVar3];
      if (fVar1 < fVar5) {
        fVar7 = fVar7 + fVar1;
      }
      iVar2 = iVar2 + (uint)(fVar1 < fVar5);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (0 < iVar2) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
            ,0xd1,"AGC NOISE: max= %6.3f\n",(double)(fVar7 / (float)iVar2));
    if (0 < nfr) {
      uVar3 = 0;
      do {
        *cep[uVar3] = (mfcc_t)((float)*cep[uVar3] - fVar7 / (float)iVar2);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  return;
}

Assistant:

void
agc_noise(agc_t *agc,
          mfcc_t **cep,
          int32 nfr)
{
    mfcc_t min_energy; /* Minimum log-energy */
    mfcc_t noise_level;        /* Average noise_level */
    int32 i;           /* frame index */
    int32 noise_frames;        /* Number of noise frames */

    /* Determine minimum log-energy in utterance */
    min_energy = cep[0][0];
    for (i = 0; i < nfr; ++i) {
        if (cep[i][0] < min_energy)
            min_energy = cep[i][0];
    }

    /* Average all frames between min_energy and min_energy + agc->noise_thresh */
    noise_frames = 0;
    noise_level = 0;
    min_energy += agc->noise_thresh;
    for (i = 0; i < nfr; ++i) {
        if (cep[i][0] < min_energy) {
            noise_level += cep[i][0];
            noise_frames++;
        }
    }

    if (noise_frames > 0) {
        noise_level /= noise_frames;
        E_INFO("AGC NOISE: max= %6.3f\n", MFCC2FLOAT(noise_level));
        /* Subtract noise_level from all log_energy values */
        for (i = 0; i < nfr; i++) {
            cep[i][0] -= noise_level;
        }
    }
}